

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRgbaThreading.cpp
# Opt level: O2

void anon_unknown.dwarf_22411e::writeReadRGBA
               (char *fileName,int width,int height,Array2D<Imf_2_5::Rgba> *p1,RgbaChannels channels
               ,LineOrder lorder,Compression comp)

{
  undefined1 *yStride;
  bool bVar1;
  int iVar2;
  LineOrder LVar3;
  Compression CVar4;
  RgbaChannels RVar5;
  ostream *poVar6;
  LineOrder *pLVar7;
  Compression *pCVar8;
  Box2i *pBVar9;
  Box2i *pBVar10;
  float *pfVar11;
  V2f *pVVar12;
  half *phVar13;
  undefined4 in_register_00000034;
  Array2D<Imf_2_5::Rgba> *src;
  char *pcVar14;
  half *phVar15;
  long lVar16;
  long lVar17;
  int numScanLines;
  long lVar18;
  long lVar19;
  float fVar20;
  RgbaOutputFile out;
  Array2D<Imf_2_5::Rgba> p2;
  float local_78;
  float local_74;
  InputFile *local_70;
  Header header;
  
  src = (Array2D<Imf_2_5::Rgba> *)CONCAT44(in_register_00000034,width);
  poVar6 = std::operator<<((ostream *)&std::cout,"channels ");
  pcVar14 = "R";
  if ((height & 1U) == 0) {
    pcVar14 = "";
  }
  poVar6 = std::operator<<(poVar6,pcVar14);
  pcVar14 = "G";
  if ((height & 2U) == 0) {
    pcVar14 = "";
  }
  poVar6 = std::operator<<(poVar6,pcVar14);
  pcVar14 = "B";
  if ((height & 4U) == 0) {
    pcVar14 = "";
  }
  poVar6 = std::operator<<(poVar6,pcVar14);
  pcVar14 = "A";
  if ((height & 8U) == 0) {
    pcVar14 = "";
  }
  poVar6 = std::operator<<(poVar6,pcVar14);
  poVar6 = std::operator<<(poVar6,", line order ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(LineOrder)p1);
  poVar6 = std::operator<<(poVar6,", compression ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,channels);
  std::endl<char,std::char_traits<char>>(poVar6);
  out._vptr_RgbaOutputFile = (_func_int **)0x0;
  Imf_2_5::Header::Header(&header,0xed,0x77,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
  pLVar7 = Imf_2_5::Header::lineOrder(&header);
  *pLVar7 = (LineOrder)p1;
  pCVar8 = Imf_2_5::Header::compression(&header);
  *pCVar8 = channels;
  remove(fileName);
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile(&out,fileName,&header,height,iVar2);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&out,src->_data,1,0xed);
  for (iVar2 = 0x77; iVar2 != 0; iVar2 = iVar2 - numScanLines) {
    fVar20 = (float)Imath_2_5::Rand32::nextf();
    numScanLines = (int)(fVar20 * (float)iVar2 + 0.5);
    Imf_2_5::RgbaOutputFile::writePixels(&out,numScanLines);
  }
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&out);
  iVar2 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)&out,fileName,iVar2);
  pBVar9 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)&out);
  lVar19 = (long)(pBVar9->min).x;
  local_70 = (InputFile *)((pBVar9->max).x - lVar19);
  yStride = (undefined1 *)((long)&(local_70->super_GenericInputFile)._vptr_GenericInputFile + 1);
  lVar18 = (long)(pBVar9->min).y;
  lVar17 = (pBVar9->max).y - lVar18;
  lVar16 = lVar17 + 1;
  Imf_2_5::Array2D<Imf_2_5::Rgba>::Array2D(&p2,lVar16,(long)yStride);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            ((RgbaInputFile *)&out,p2._data + (-lVar18 * p2._sizeY - lVar19),1,(size_t)yStride);
  Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)&out,(pBVar9->min).y,(pBVar9->max).y);
  pBVar9 = Imf_2_5::RgbaInputFile::displayWindow((RgbaInputFile *)&out);
  pBVar10 = Imf_2_5::Header::displayWindow(&header);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar9,pBVar10);
  if (!bVar1) {
    __assert_fail("in.displayWindow() == header.displayWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x8b,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  pBVar9 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)&out);
  pBVar10 = Imf_2_5::Header::dataWindow(&header);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==(pBVar9,pBVar10);
  if (!bVar1) {
    __assert_fail("in.dataWindow() == header.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x8c,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  fVar20 = Imf_2_5::RgbaInputFile::pixelAspectRatio((RgbaInputFile *)&out);
  pfVar11 = Imf_2_5::Header::pixelAspectRatio(&header);
  if ((fVar20 == *pfVar11) && (!NAN(fVar20) && !NAN(*pfVar11))) {
    Imf_2_5::RgbaInputFile::screenWindowCenter((RgbaInputFile *)&local_78);
    pVVar12 = Imf_2_5::Header::screenWindowCenter(&header);
    if ((((local_78 != pVVar12->x) || (NAN(local_78) || NAN(pVVar12->x))) ||
        (local_74 != pVVar12->y)) || (NAN(local_74) || NAN(pVVar12->y))) {
      __assert_fail("in.screenWindowCenter() == header.screenWindowCenter()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                    ,0x8e,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    fVar20 = Imf_2_5::RgbaInputFile::screenWindowWidth((RgbaInputFile *)&out);
    pfVar11 = Imf_2_5::Header::screenWindowWidth(&header);
    if ((fVar20 != *pfVar11) || (NAN(fVar20) || NAN(*pfVar11))) {
      __assert_fail("in.screenWindowWidth() == header.screenWindowWidth()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                    ,0x8f,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    LVar3 = Imf_2_5::RgbaInputFile::lineOrder((RgbaInputFile *)&out);
    pLVar7 = Imf_2_5::Header::lineOrder(&header);
    if (LVar3 != *pLVar7) {
      __assert_fail("in.lineOrder() == header.lineOrder()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                    ,0x90,
                    "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                   );
    }
    CVar4 = Imf_2_5::RgbaInputFile::compression((RgbaInputFile *)&out);
    pCVar8 = Imf_2_5::Header::compression(&header);
    if (CVar4 == *pCVar8) {
      RVar5 = Imf_2_5::RgbaInputFile::channels((RgbaInputFile *)&out);
      if (RVar5 != height) {
        __assert_fail("in.channels() == channels",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                      ,0x92,
                      "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                     );
      }
      CVar4 = Imf_2_5::RgbaInputFile::compression((RgbaInputFile *)&out);
      iVar2 = (int)lVar16;
      if ((CVar4 == B44_COMPRESSION) ||
         (CVar4 = Imf_2_5::RgbaInputFile::compression((RgbaInputFile *)&out),
         CVar4 == B44A_COMPRESSION)) {
        compareB44((int)yStride,iVar2,src,&p2,height);
      }
      else {
        CVar4 = Imf_2_5::RgbaInputFile::compression((RgbaInputFile *)&out);
        if ((CVar4 == DWAA_COMPRESSION) ||
           (CVar4 = Imf_2_5::RgbaInputFile::compression((RgbaInputFile *)&out),
           CVar4 == DWAB_COMPRESSION)) {
          compareDwa((int)yStride,iVar2,src,&p2,height);
        }
        else {
          phVar15 = &src->_data->a;
          phVar13 = &(p2._data)->a;
          for (lVar16 = 0; lVar16 <= (int)lVar17; lVar16 = lVar16 + 1) {
            for (lVar18 = 0; lVar18 <= (int)local_70; lVar18 = lVar18 + 1) {
              fVar20 = *(float *)((long)&half::_toFloat + (ulong)phVar13[lVar18 * 4 + -3]._h * 4);
              if ((height & 1U) == 0) {
                if ((fVar20 != 0.0) || (NAN(fVar20))) {
                  __assert_fail("p2[y][x].r == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                ,0xa7,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else {
                pfVar11 = (float *)((long)&half::_toFloat + (ulong)phVar15[lVar18 * 4 + -3]._h * 4);
                if ((fVar20 != *pfVar11) || (NAN(fVar20) || NAN(*pfVar11))) {
                  __assert_fail("p2[y][x].r == p1[y][x].r",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                ,0xa5,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              fVar20 = *(float *)((long)&half::_toFloat + (ulong)phVar13[lVar18 * 4 + -2]._h * 4);
              if ((height & 2U) == 0) {
                if ((fVar20 != 0.0) || (NAN(fVar20))) {
                  __assert_fail("p2[y][x].g == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                ,0xac,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else {
                pfVar11 = (float *)((long)&half::_toFloat + (ulong)phVar15[lVar18 * 4 + -2]._h * 4);
                if ((fVar20 != *pfVar11) || (NAN(fVar20) || NAN(*pfVar11))) {
                  __assert_fail("p2[y][x].g == p1[y][x].g",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                ,0xaa,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              fVar20 = *(float *)((long)&half::_toFloat + (ulong)phVar13[lVar18 * 4 + -1]._h * 4);
              if ((height & 4U) == 0) {
                if ((fVar20 != 0.0) || (NAN(fVar20))) {
                  __assert_fail("p2[y][x].b == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                ,0xb1,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else {
                pfVar11 = (float *)((long)&half::_toFloat + (ulong)phVar15[lVar18 * 4 + -1]._h * 4);
                if ((fVar20 != *pfVar11) || (NAN(fVar20) || NAN(*pfVar11))) {
                  __assert_fail("p2[y][x].b == p1[y][x].b",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                ,0xaf,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              fVar20 = *(float *)((long)&half::_toFloat + (ulong)phVar13[lVar18 * 4]._h * 4);
              if ((height & 8U) == 0) {
                if ((fVar20 != 1.0) || (NAN(fVar20))) {
                  __assert_fail("p2[y][x].a == 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                ,0xb6,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
              else {
                pfVar11 = (float *)((long)&half::_toFloat + (ulong)phVar15[lVar18 * 4]._h * 4);
                if ((fVar20 != *pfVar11) || (NAN(fVar20) || NAN(*pfVar11))) {
                  __assert_fail("p2[y][x].a == p1[y][x].a",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                                ,0xb4,
                                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                               );
                }
              }
            }
            phVar15 = phVar15 + src->_sizeY * 4;
            phVar13 = phVar13 + p2._sizeY * 4;
          }
        }
      }
      Imf_2_5::Array2D<Imf_2_5::Rgba>::~Array2D(&p2);
      Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)&out);
      remove(fileName);
      Imf_2_5::Header::~Header(&header);
      return;
    }
    __assert_fail("in.compression() == header.compression()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                  ,0x91,
                  "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
                 );
  }
  __assert_fail("in.pixelAspectRatio() == header.pixelAspectRatio()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testRgbaThreading.cpp"
                ,0x8d,
                "void (anonymous namespace)::writeReadRGBA(const char *, int, int, const Array2D<Rgba> &, RgbaChannels, LineOrder, Compression)"
               );
}

Assistant:

void
writeReadRGBA (const char fileName[],
	       int width,
	       int height,
	       const Array2D<Rgba> &p1,
	       RgbaChannels channels,
	       LineOrder lorder,
	       Compression comp)
{
    //
    // Save the selected channels of RGBA image p1; save the
    // scan lines in the specified order.  Read the image back
    // from the file, and compare the data with the orignal.
    //

    cout << "channels " <<
	    ((channels & WRITE_R)? "R": "") <<
	    ((channels & WRITE_G)? "G": "") <<
	    ((channels & WRITE_B)? "B": "") <<
	    ((channels & WRITE_A)? "A": "") <<
	    ", line order " << lorder <<
	    ", compression " << comp << endl;

    Header header (width, height);
    header.lineOrder() = lorder;
    header.compression() = comp;

    {
	remove (fileName);
	RgbaOutputFile out (fileName, header, channels);
        out.setFrameBuffer (&p1[0][0], 1, width);
        
        int numLeft = height;
        int numWrite = 1;

	//
        // Iterate over all scanlines, and write them out in random-size chunks
	//

        while (numLeft)
        {
            numWrite = int (rand1.nextf() * numLeft + 0.5f);
            out.writePixels (numWrite);
            numLeft -= numWrite;
        }
    }

    {
	RgbaInputFile in (fileName);
	const Box2i &dw = in.dataWindow();
	
	int w = dw.max.x - dw.min.x + 1;
	int h = dw.max.y - dw.min.y + 1;
	int dx = dw.min.x;
	int dy = dw.min.y;

	Array2D<Rgba> p2 (h, w);
	in.setFrameBuffer (&p2[-dy][-dx], 1, w);
	in.readPixels (dw.min.y, dw.max.y);

	assert (in.displayWindow() == header.displayWindow());
	assert (in.dataWindow() == header.dataWindow());
	assert (in.pixelAspectRatio() == header.pixelAspectRatio());
	assert (in.screenWindowCenter() == header.screenWindowCenter());
	assert (in.screenWindowWidth() == header.screenWindowWidth());
	assert (in.lineOrder() == header.lineOrder());
	assert (in.compression() == header.compression());
	assert (in.channels() == channels);

	if (in.compression() == B44_COMPRESSION ||
	    in.compression() == B44A_COMPRESSION)
	{
	    compareB44 (w, h, p1, p2, channels);
	}
	else if (in.compression() == DWAA_COMPRESSION ||
	         in.compression() == DWAB_COMPRESSION)
	{
	    compareDwa (w, h, p1, p2, channels);
	}
	else
	{
	    for (int y = 0; y < h; ++y)
	    {
		for (int x = 0; x < w; ++x)
		{
		    if (channels & WRITE_R)
			assert (p2[y][x].r == p1[y][x].r);
		    else
			assert (p2[y][x].r == 0);

		    if (channels & WRITE_G)
			assert (p2[y][x].g == p1[y][x].g);
		    else
			assert (p2[y][x].g == 0);

		    if (channels & WRITE_B)
			assert (p2[y][x].b == p1[y][x].b);
		    else
			assert (p2[y][x].b == 0);

		    if (channels & WRITE_A)
			assert (p2[y][x].a == p1[y][x].a);
		    else
			assert (p2[y][x].a == 1);
		}
	    }
	}
    }

    remove (fileName);
}